

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int value;
  int value_00;
  int i;
  long lVar1;
  long lVar2;
  SubstituteArg local_2e8;
  SubstituteArg local_2b8;
  SubstituteArg local_288;
  SubstituteArg local_258;
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  string prefix;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  string local_e8;
  SourceLocationCommentPrinter comment_printer;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  local_118.text_ = prefix._M_dataplus._M_p;
  local_118.size_ = (int)prefix._M_string_length;
  local_148.text_ = (char *)**(undefined8 **)(this + 8);
  local_148.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
  local_178.text_ = (char *)0x0;
  local_178.size_ = -1;
  local_1a8.text_ = (char *)0x0;
  local_1a8.size_ = -1;
  local_2e8.text_ = (char *)0x0;
  local_2e8.size_ = -1;
  local_1f8.text_ = (char *)0x0;
  local_1f8.size_ = -1;
  local_228.text_ = (char *)0x0;
  local_228.size_ = -1;
  local_258.text_ = (char *)0x0;
  local_258.size_ = -1;
  local_288.text_ = (char *)0x0;
  local_288.size_ = -1;
  local_2b8.text_ = (char *)0x0;
  local_2b8.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0enum $1 {\n",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
             &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
  anon_unknown_1::FormatLineOptions
            (depth + 1,*(Message **)(this + 0x20),
             *(DescriptorPool **)(*(long *)(this + 0x10) + 0x10),contents);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this + 4); lVar1 = lVar1 + 1) {
    EnumValueDescriptor::DebugString
              ((EnumValueDescriptor *)(*(long *)(this + 0x28) + lVar2),depth + 1,contents,
               debug_string_options);
    lVar2 = lVar2 + 0x20;
  }
  if (0 < *(int *)(this + 0x30)) {
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_2e8.text_ = (char *)0x0;
    local_2e8.size_ = -1;
    local_1f8.text_ = (char *)0x0;
    local_1f8.size_ = -1;
    local_228.text_ = (char *)0x0;
    local_228.size_ = -1;
    local_258.text_ = (char *)0x0;
    local_258.size_ = -1;
    local_288.text_ = (char *)0x0;
    local_118.text_ = prefix._M_dataplus._M_p;
    local_288.size_ = -1;
    local_2b8.text_ = (char *)0x0;
    local_118.size_ = (int)prefix._M_string_length;
    local_2b8.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
               &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
    for (lVar1 = 0; lVar1 < *(int *)(this + 0x30); lVar1 = lVar1 + 1) {
      lVar2 = *(long *)(this + 0x38);
      value = *(int *)(lVar2 + lVar1 * 8);
      value_00 = *(int *)(lVar2 + 4 + lVar1 * 8);
      if (value_00 == value) {
        strings::internal::SubstituteArg::SubstituteArg(&local_118,value_00);
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_2e8.text_ = (char *)0x0;
        local_2e8.size_ = -1;
        local_1f8.text_ = (char *)0x0;
        local_1f8.size_ = -1;
        local_228.text_ = (char *)0x0;
        local_228.size_ = -1;
        local_258.text_ = (char *)0x0;
        local_258.size_ = -1;
        local_288.text_ = (char *)0x0;
        local_288.size_ = -1;
        local_2b8.text_ = (char *)0x0;
        local_2b8.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0, ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,&local_1f8
                   ,&local_228,&local_258,&local_288,&local_2b8);
      }
      else if (value_00 == 0x7fffffff) {
        strings::internal::SubstituteArg::SubstituteArg(&local_118,value);
        local_148.text_ = (char *)0x0;
        local_148.size_ = -1;
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_2e8.text_ = (char *)0x0;
        local_2e8.size_ = -1;
        local_1f8.text_ = (char *)0x0;
        local_1f8.size_ = -1;
        local_228.text_ = (char *)0x0;
        local_228.size_ = -1;
        local_258.text_ = (char *)0x0;
        local_258.size_ = -1;
        local_288.text_ = (char *)0x0;
        local_288.size_ = -1;
        local_2b8.text_ = (char *)0x0;
        local_2b8.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0 to max, ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
                   &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
      }
      else {
        strings::internal::SubstituteArg::SubstituteArg(&local_118,value);
        strings::internal::SubstituteArg::SubstituteArg(&local_148,*(int *)(lVar2 + 4 + lVar1 * 8));
        local_178.text_ = (char *)0x0;
        local_178.size_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_2e8.text_ = (char *)0x0;
        local_2e8.size_ = -1;
        local_1f8.text_ = (char *)0x0;
        local_1f8.size_ = -1;
        local_228.text_ = (char *)0x0;
        local_228.size_ = -1;
        local_258.text_ = (char *)0x0;
        local_258.size_ = -1;
        local_288.text_ = (char *)0x0;
        local_288.size_ = -1;
        local_2b8.text_ = (char *)0x0;
        local_2b8.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0 to $1, ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
                   &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
      }
    }
    std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
  }
  if (0 < *(int *)(this + 0x34)) {
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_2e8.text_ = (char *)0x0;
    local_2e8.size_ = -1;
    local_1f8.text_ = (char *)0x0;
    local_1f8.size_ = -1;
    local_228.text_ = (char *)0x0;
    local_228.size_ = -1;
    local_258.text_ = (char *)0x0;
    local_258.size_ = -1;
    local_288.text_ = (char *)0x0;
    local_118.text_ = prefix._M_dataplus._M_p;
    local_288.size_ = -1;
    local_2b8.text_ = (char *)0x0;
    local_118.size_ = (int)prefix._M_string_length;
    local_2b8.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
               &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
    for (lVar1 = 0; lVar1 < *(int *)(this + 0x34); lVar1 = lVar1 + 1) {
      CEscape(&local_e8,*(string **)(*(long *)(this + 0x40) + lVar1 * 8));
      local_148.text_ = (char *)0x0;
      local_148.size_ = -1;
      local_178.text_ = (char *)0x0;
      local_178.size_ = -1;
      local_1a8.text_ = (char *)0x0;
      local_1a8.size_ = -1;
      local_2e8.text_ = (char *)0x0;
      local_2e8.size_ = -1;
      local_1f8.text_ = (char *)0x0;
      local_1f8.size_ = -1;
      local_228.text_ = (char *)0x0;
      local_228.size_ = -1;
      local_258.text_ = (char *)0x0;
      local_258.size_ = -1;
      local_288.text_ = (char *)0x0;
      local_118.text_ = local_e8._M_dataplus._M_p;
      local_288.size_ = -1;
      local_2b8.text_ = (char *)0x0;
      local_118.size_ = (int)local_e8._M_string_length;
      local_2b8.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"\"$0\", ",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,
                 &local_1f8,&local_228,&local_258,&local_288,&local_2b8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    std::__cxx11::string::replace((ulong)contents,contents->_M_string_length - 2,(char *)0x2);
  }
  local_148.text_ = (char *)0x0;
  local_148.size_ = -1;
  local_178.text_ = (char *)0x0;
  local_178.size_ = -1;
  local_1a8.text_ = (char *)0x0;
  local_1a8.size_ = -1;
  local_2e8.text_ = (char *)0x0;
  local_2e8.size_ = -1;
  local_1f8.text_ = (char *)0x0;
  local_1f8.size_ = -1;
  local_228.text_ = (char *)0x0;
  local_228.size_ = -1;
  local_258.text_ = (char *)0x0;
  local_258.size_ = -1;
  local_288.text_ = (char *)0x0;
  local_118.text_ = prefix._M_dataplus._M_p;
  local_288.size_ = -1;
  local_2b8.text_ = (char *)0x0;
  local_118.size_ = (int)prefix._M_string_length;
  local_2b8.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_118,&local_148,&local_178,&local_1a8,&local_2e8,&local_1f8,
             &local_228,&local_258,&local_288,&local_2b8);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n", prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        strings::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}